

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  cmListFileLexer_Token *pcVar4;
  char *pcVar5;
  bool bVar6;
  cmListFileLexer_BOM bom;
  string local_1c8;
  ostringstream m;
  
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,this->FileName,&bom);
  if (iVar2 == 0) {
    cmSystemTools::Error
              ("cmListFileCache: error can not open file ",this->FileName,(char *)0x0,(char *)0x0);
    return false;
  }
  if (bom < cmListFileLexer_BOM_UTF16BE) {
    bVar1 = true;
switchD_003ba9c2_caseD_1:
    pcVar4 = cmListFileLexer_Scan(this->Lexer);
    bVar6 = pcVar4 == (cmListFileLexer_Token *)0x0;
    if (bVar6) {
      return bVar6;
    }
    switch(pcVar4->type) {
    case cmListFileLexer_Token_Space:
      goto switchD_003ba9c2_caseD_1;
    case cmListFileLexer_Token_Newline:
      bVar1 = true;
      goto switchD_003ba9c2_caseD_1;
    case cmListFileLexer_Token_Identifier:
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
        poVar3 = std::operator<<((ostream *)&m,"Error in cmake code at\n");
        poVar3 = std::operator<<(poVar3,this->FileName);
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcVar4->line);
        poVar3 = std::operator<<(poVar3,":\n");
        poVar3 = std::operator<<(poVar3,"Parse error.  Expected a newline, got ");
        pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
        poVar3 = std::operator<<(poVar3,pcVar5);
        poVar3 = std::operator<<(poVar3," with text \"");
        poVar3 = std::operator<<(poVar3,pcVar4->text);
        std::operator<<(poVar3,"\".");
        std::__cxx11::stringbuf::str();
        cmSystemTools::Error(local_1c8._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        goto LAB_003baabe;
      }
      bVar1 = ParseFunction(this,pcVar4->text,(long)pcVar4->line);
      if (!bVar1) {
        return bVar6;
      }
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
                (&this->ListFile->Functions,&this->Function);
    case cmListFileLexer_Token_CommentBracket:
      bVar1 = false;
      goto switchD_003ba9c2_caseD_1;
    default:
      goto switchD_003ba9c2_caseD_4;
    }
  }
  cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
  poVar3 = std::operator<<((ostream *)&m,"File\n  ");
  poVar3 = std::operator<<(poVar3,this->FileName);
  poVar3 = std::operator<<(poVar3,"\n");
  std::operator<<(poVar3,"starts with a Byte-Order-Mark that is not UTF-8.");
  this_00 = this->Makefile;
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c8);
LAB_003baabe:
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m);
  return false;
switchD_003ba9c2_caseD_4:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
  poVar3 = std::operator<<((ostream *)&m,"Error in cmake code at\n");
  poVar3 = std::operator<<(poVar3,this->FileName);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pcVar4->line);
  poVar3 = std::operator<<(poVar3,":\n");
  poVar3 = std::operator<<(poVar3,"Parse error.  Expected a command name, got ");
  pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3," with text \"");
  poVar3 = std::operator<<(poVar3,pcVar4->text);
  std::operator<<(poVar3,"\".");
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(local_1c8._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
  goto LAB_003baabe;
}

Assistant:

bool cmListFileParser::ParseFile()
{
  // Open the file.
  cmListFileLexer_BOM bom;
  if(!cmListFileLexer_SetFileName(this->Lexer, this->FileName, &bom))
    {
    cmSystemTools::Error("cmListFileCache: error can not open file ",
                         this->FileName);
    return false;
    }

  // Verify the Byte-Order-Mark, if any.
  if(bom != cmListFileLexer_BOM_None &&
     bom != cmListFileLexer_BOM_UTF8)
    {
    cmListFileLexer_SetFileName(this->Lexer, 0, 0);
    std::ostringstream m;
    m << "File\n  " << this->FileName << "\n"
      << "starts with a Byte-Order-Mark that is not UTF-8.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, m.str());
    return false;
    }

  // Use a simple recursive-descent parser to process the token
  // stream.
  bool haveNewline = true;
  while(cmListFileLexer_Token* token =
        cmListFileLexer_Scan(this->Lexer))
    {
    if(token->type == cmListFileLexer_Token_Space)
      {
      }
    else if(token->type == cmListFileLexer_Token_Newline)
      {
      haveNewline = true;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      haveNewline = false;
      }
    else if(token->type == cmListFileLexer_Token_Identifier)
      {
      if(haveNewline)
        {
        haveNewline = false;
        if(this->ParseFunction(token->text, token->line))
          {
          this->ListFile->Functions.push_back(this->Function);
          }
        else
          {
          return false;
          }
        }
      else
        {
        std::ostringstream error;
        error << "Error in cmake code at\n"
              << this->FileName << ":" << token->line << ":\n"
              << "Parse error.  Expected a newline, got "
              << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
              << " with text \"" << token->text << "\".";
        cmSystemTools::Error(error.str().c_str());
        return false;
        }
      }
    else
      {
      std::ostringstream error;
      error << "Error in cmake code at\n"
            << this->FileName << ":" << token->line << ":\n"
            << "Parse error.  Expected a command name, got "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \""
            << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }
  return true;
}